

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O1

void __thiscall
hiberlite::AVisitor<hiberlite::LoadBean>::~AVisitor(AVisitor<hiberlite::LoadBean> *this)

{
  int *piVar1;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar2;
  pointer pcVar3;
  
  (this->rootKey).con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  psVar2 = (this->rootKey).con.res;
  if (psVar2 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &psVar2->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*psVar2->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  pcVar3 = (this->scope)._prefix._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->scope)._prefix.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->scope)._table._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->scope)._table.field_2) {
    operator_delete(pcVar3);
  }
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::~deque(&(this->stack).c);
  return;
}

Assistant:

AVisitor<C>::~AVisitor() {}